

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  string *value;
  bool bVar1;
  SourceCodeInfo *other;
  LogMessage *pLVar2;
  Arena *arena;
  byte bVar3;
  string_view text;
  string_view text_00;
  string_view text_01;
  LogMessage local_a0 [16];
  LocationRecorder root_location;
  SourceCodeInfo source_code_info;
  
  this->input_ = input;
  this->had_errors_ = false;
  (this->syntax_identifier_)._M_string_length = 0;
  *(this->syntax_identifier_)._M_dataplus._M_p = '\0';
  SourceCodeInfo::SourceCodeInfo(&source_code_info);
  this->source_code_info_ = &source_code_info;
  if ((this->input_->current_).type == TYPE_START) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
               &this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder(&root_location,this);
  LocationRecorder::RecordLegacyLocation(&root_location,&file->super_Message,OTHER);
  value = &this->syntax_identifier_;
  if (this->require_syntax_identifier_ == false) {
    text._M_str = "syntax";
    text._M_len = 6;
    bVar1 = LookingAt(this,text);
    if (bVar1) goto LAB_001aacc2;
    text_00._M_str = "edition";
    text_00._M_len = 7;
    bVar1 = LookingAt(this,text_00);
    if (bVar1) goto LAB_001aacc2;
    if (this->stop_after_syntax_identifier_ == false) {
      absl::lts_20240722::log_internal::LogMessage::LogMessage
                (local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/parser.cc"
                 ,0x2ae);
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (local_a0,(char (*) [41])"No syntax specified for the proto file: ");
      pLVar2 = (LogMessage *)
               absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar2,(string *)
                                 ((ulong)(file->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                                 0xfffffffffffffffc));
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar2,(char (*) [35])". Please use \'syntax = \"proto2\";\' ");
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                         (pLVar2,(char (*) [45])"or \'syntax = \"proto3\";\' to specify a syntax ");
      absl::lts_20240722::log_internal::LogMessage::operator<<
                (pLVar2,(char (*) [39])"version. (Defaulted to proto2 syntax.)");
      absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_a0);
      std::__cxx11::string::assign((char *)value);
    }
LAB_001aad2a:
    if (this->stop_after_syntax_identifier_ == false) {
      bVar3 = 1;
      while ((this->input_->current_).type != TYPE_END) {
        bVar1 = ParseTopLevelStatement(this,file,&root_location);
        if (!bVar1) {
          SkipStatement(this);
          text_01._M_str = "}";
          text_01._M_len = 1;
          bVar1 = LookingAt(this,text_01);
          if (bVar1) {
            RecordError(this,(ErrorMaker)ZEXT816(0x2fb08a));
            io::Tokenizer::NextWithComments
                      (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
                       &this->upcoming_doc_comments_);
          }
        }
      }
      bVar1 = true;
      goto LAB_001aadab;
    }
    bVar3 = this->had_errors_ ^ 1;
  }
  else {
LAB_001aacc2:
    bVar1 = ParseSyntaxIdentifier(this,file,&root_location);
    if (bVar1) {
      if (file != (FileDescriptorProto *)0x0) {
        *(byte *)&file->field_0 = *(byte *)&file->field_0 | 4;
        arena = (Arena *)(file->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>(&(file->field_0)._impl_.syntax_,value,arena);
        bVar1 = std::operator==(value,"editions");
        if (bVar1) {
          FileDescriptorProto::set_edition(file,this->edition_);
        }
      }
      goto LAB_001aad2a;
    }
    bVar3 = 0;
  }
  bVar1 = false;
LAB_001aadab:
  LocationRecorder::~LocationRecorder(&root_location);
  if (bVar1) {
    this->input_ = (Tokenizer *)0x0;
    this->source_code_info_ = (SourceCodeInfo *)0x0;
    if (file == (FileDescriptorProto *)0x0) {
      __assert_fail("file != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/parser.cc"
                    ,0x2ca,
                    "bool google::protobuf::compiler::Parser::Parse(io::Tokenizer *, FileDescriptorProto *)"
                   );
    }
    other = FileDescriptorProto::mutable_source_code_info(file);
    SourceCodeInfo::Swap(&source_code_info,other);
    bVar3 = this->had_errors_ ^ 1;
  }
  SourceCodeInfo::~SourceCodeInfo(&source_code_info);
  return (bool)(bVar3 & 1);
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(nullptr, &upcoming_detached_comments_,
                             &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);
    root_location.RecordLegacyLocation(file,
                                       DescriptorPool::ErrorCollector::OTHER);

    if (require_syntax_identifier_ || LookingAt("syntax") ||
        LookingAt("edition")) {
      if (!ParseSyntaxIdentifier(file, root_location)) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
      // Store the syntax into the file.
      if (file != nullptr) {
        file->set_syntax(syntax_identifier_);
        if (syntax_identifier_ == "editions") {
          file->set_edition(edition_);
        }
      }
    } else if (!stop_after_syntax_identifier_) {
      ABSL_LOG(WARNING) << "No syntax specified for the proto file: "
                        << file->name()
                        << ". Please use 'syntax = \"proto2\";' "
                        << "or 'syntax = \"proto3\";' to specify a syntax "
                        << "version. (Defaulted to proto2 syntax.)";
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          RecordError("Unmatched \"}\".");
          input_->NextWithComments(nullptr, &upcoming_detached_comments_,
                                   &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = nullptr;
  source_code_info_ = nullptr;
  assert(file != nullptr);
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}